

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O1

void __thiscall Start::outputCreditsAndBetCurrentFreeGames(Start *this,double *credits,uint *bet)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Current Credit: ",0x10);
  poVar1 = std::ostream::_M_insert<double>(*credits);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Euro.",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Current Bet: ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"No Bet in Free Games!",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

void Start::outputCreditsAndBetCurrentFreeGames(double& credits, unsigned int& bet) {
	std::cout << "Current Credit: " << credits << " Euro." << std::endl;
	std::cout << "Current Bet: " << "No Bet in Free Games!" << std::endl;
}